

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::powExpr(Parser *this)

{
  long lVar1;
  Report *this_00;
  Opcode op;
  LiteralType args;
  LiteralType args_2;
  _Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_> this_01;
  pointer *__ptr;
  long in_RSI;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> lhs;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> rhs;
  SourceLocation sloc;
  undefined1 local_a8 [16];
  _Base_ptr local_98;
  undefined1 local_90 [32];
  SymbolTable *local_70;
  __uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_> local_68;
  undefined1 local_58 [24];
  pointer puStack_40;
  _Invoker_type local_38;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  local_68._M_t.super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
  .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
       (tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)local_58;
  local_a8._8_8_ = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,*(long *)(lVar1 + 0x68),
             *(long *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68));
  local_38 = *(_Invoker_type *)(lVar1 + 0x98);
  local_58._16_8_ = *(undefined8 *)(lVar1 + 0x88);
  puStack_40 = *(pointer *)(lVar1 + 0x90);
  negExpr((Parser *)local_a8);
  if ((_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_a8._0_8_
      == (Expr *)0x0) {
LAB_0012436d:
    ((ASTNode *)local_a8._8_8_)->_vptr_ASTNode = (_func_int **)0x0;
  }
  else {
    do {
      if ((*(Lexer **)(in_RSI + 0x30))->token_ != Pow) {
        ((ASTNode *)local_a8._8_8_)->_vptr_ASTNode = (_func_int **)local_a8._0_8_;
        local_a8._0_8_ = (BinaryExpr *)0x0;
        break;
      }
      Lexer::nextToken(*(Lexer **)(in_RSI + 0x30));
      powExpr((Parser *)&local_98);
      if (local_98 == (_Base_ptr)0x0) goto LAB_0012436d;
      op = makeOperator(Pow,(Expr *)local_a8._0_8_,(Expr *)local_98);
      if (op == EXIT) {
        lVar1 = *(long *)(in_RSI + 0x30);
        this_00 = *(Report **)(in_RSI + 0x68);
        local_90._0_8_ = local_90 + 0x10;
        local_70 = (SymbolTable *)0x33;
        local_90._0_8_ = std::__cxx11::string::_M_create((ulong *)local_90,(ulong)&local_70);
        local_90._16_8_ = local_70;
        *(undefined8 *)(local_90._0_8_ + 0x20) = 0x2073646e61726570;
        ((_Base_ptr)(local_90._0_8_ + 0x20))->_M_parent = (_Base_ptr)0x7b207d7b207d7b28;
        ((_Base_ptr)local_90._0_8_)->_M_left = (_Base_ptr)0x7270786520797261;
        ((_Base_ptr)local_90._0_8_)->_M_right = (_Base_ptr)0x6f206e6f69737365;
        ((_Base_ptr)local_90._0_8_)->_M_color = 0x6f636e49;
        ((_Base_ptr)local_90._0_8_)->field_0x4 = 'm';
        ((_Base_ptr)local_90._0_8_)->field_0x5 = 'p';
        ((_Base_ptr)local_90._0_8_)->field_0x6 = 'a';
        ((_Base_ptr)local_90._0_8_)->field_0x7 = 't';
        *(undefined4 *)&((_Base_ptr)local_90._0_8_)->_M_parent = 0x656c6269;
        builtin_strncpy((char *)((long)&((_Base_ptr)local_90._0_8_)->_M_parent + 4)," bin",4);
        *(undefined4 *)((long)&((_Base_ptr)(local_90._0_8_ + 0x20))->_M_parent + 7) = 0x2e297d7b;
        local_90._8_8_ = local_70;
        *(undefined1 *)
         ((long)&(local_70->symbols_).
                 super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
         (long)&((_Base_ptr)local_90._0_8_)->_M_color) = 0;
        args = (**(code **)(*(long *)local_a8._0_8_ + 0x18))();
        args_2 = (**(code **)(*(long *)local_98 + 0x18))();
        diagnostics::Report::typeError<flow::LiteralType,flow::lang::Token,flow::LiteralType>
                  (this_00,(SourceLocation *)(lVar1 + 0x30),(string *)local_90,args,Pow,args_2);
        if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
        ((ASTNode *)local_a8._8_8_)->_vptr_ASTNode = (_func_int **)0x0;
        this_01.super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
             (_Head_base<0UL,_flow::lang::Expr_*,_false>)
             (_Head_base<0UL,_flow::lang::Expr_*,_false>)local_a8._0_8_;
      }
      else {
        this_01.super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
             (_Head_base<0UL,_flow::lang::Expr_*,_false>)operator_new(0x58);
        BinaryExpr::BinaryExpr
                  ((BinaryExpr *)
                   this_01.super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl,op,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_a8,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_98
                  );
        if ((_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)
            local_a8._0_8_ != (Expr *)0x0) {
          lVar1 = *(long *)local_a8._0_8_;
          local_a8._0_8_ = this_01.super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
          (**(code **)(lVar1 + 8))();
          this_01.super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
               (_Head_base<0UL,_flow::lang::Expr_*,_false>)
               (_Head_base<0UL,_flow::lang::Expr_*,_false>)local_a8._0_8_;
        }
      }
      local_a8._0_8_ = this_01.super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
      if (local_98 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_98 + 8))();
      }
    } while (op != EXIT);
  }
  if ((Expr *)local_a8._0_8_ != (Expr *)0x0) {
    (**(code **)(*(long *)local_a8._0_8_ + 8))();
  }
  if (local_68._M_t.
      super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
      super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)local_58) {
    operator_delete((void *)local_68._M_t.
                            super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                            .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl,
                    local_58._0_8_ + 1);
  }
  return (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>)
         (Expr *)local_a8._8_8_;
}

Assistant:

std::unique_ptr<Expr> Parser::powExpr() {
  // powExpr ::= negExpr ('**' powExpr)*
  SourceLocation sloc(location());
  std::unique_ptr<Expr> lhs = negExpr();
  if (!lhs) return nullptr;

  while (token() == Token::Pow) {
    nextToken();

    std::unique_ptr<Expr> rhs = powExpr();
    if (!rhs) return nullptr;

    auto opc = makeOperator(Token::Pow, lhs.get(), rhs.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Incompatible binary expression operands ({} {} {}).",
          lhs->getType(), Token::Pow, rhs->getType());
      return nullptr;
    }

    lhs = std::make_unique<BinaryExpr>(opc, std::move(lhs), std::move(rhs));
  }

  return lhs;
}